

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

value * __thiscall cppcms::json::value::at(value *this,char *path)

{
  value *pvVar1;
  bad_value_cast *this_00;
  long *plVar2;
  size_type *psVar3;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  pvVar1 = find(this,path);
  if ((((pvVar1->d).d.ptr_)->value_).type != is_undefined) {
    return pvVar1;
  }
  this_00 = (bad_value_cast *)__cxa_allocate_exception(0x48);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Value not found at ","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_68);
  local_48._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_48._M_dataplus._M_p == psVar3) {
    local_48.field_2._M_allocated_capacity = *psVar3;
    local_48.field_2._8_8_ = plVar2[3];
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = *psVar3;
  }
  local_48._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  bad_value_cast::bad_value_cast(this_00,&local_48);
  __cxa_throw(this_00,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
}

Assistant:

value const &value::at(char const *path) const
	{
		value const &v=find(path);
		if(v.is_undefined())
			throw bad_value_cast(std::string("Value not found at ")+path );
		return v;
	}